

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

uchar * __thiscall
cimg_library::CImg<unsigned_char>::max_min<double>(CImg<unsigned_char> *this,double *min_val)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  bool bVar4;
  byte *pbVar5;
  CImgInstanceException *this_00;
  byte bVar6;
  byte *pbVar7;
  byte bVar8;
  char *pcVar9;
  
  bVar4 = is_empty(this);
  if (!bVar4) {
    pbVar2 = this->_data;
    bVar6 = *pbVar2;
    pbVar5 = pbVar2;
    pbVar3 = pbVar2 + this->_height * this->_width * this->_depth * this->_spectrum;
    bVar8 = bVar6;
    while (pbVar7 = pbVar3 + -1, pbVar2 < pbVar3) {
      bVar1 = *pbVar7;
      if (bVar6 < bVar1) {
        pbVar5 = pbVar7;
        bVar6 = bVar1;
      }
      pbVar3 = pbVar7;
      if (bVar1 < bVar8) {
        bVar8 = bVar1;
      }
    }
    *min_val = (double)bVar8;
    return pbVar5;
  }
  this_00 = (CImgInstanceException *)__cxa_allocate_exception(0x4008);
  pcVar9 = "non-";
  if (this->_is_shared != false) {
    pcVar9 = "";
  }
  CImgInstanceException::CImgInstanceException
            (this_00,"[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::max_min() : Empty instance.",
             (ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
             this->_data,pcVar9,"unsigned char");
  __cxa_throw(this_00,&CImgInstanceException::typeinfo,std::exception::~exception);
}

Assistant:

const T& max_min(t& min_val) const {
      if (is_empty())
        throw CImgInstanceException(_cimg_instance
                                    "max_min() : Empty instance.",
                                    cimg_instance);
      const T *ptr_max = _data;
      T max_value = *ptr_max, min_value = max_value;
      cimg_for(*this,ptrs,T) {
        const T val = *ptrs;
        if (val>max_value) { max_value = val; ptr_max = ptrs; }
        if (val<min_value) min_value = val;
      }
      min_val = (t)min_value;
      return *ptr_max;
    }